

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSCrolling.h
# Opt level: O1

void __thiscall
chrono::ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::
InjectConstraints(ChContactNSCrolling<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                  *this,ChSystemDescriptor *mdescriptor)

{
  (*mdescriptor->_vptr_ChSystemDescriptor[3])
            (mdescriptor,
             &(this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
              Nx);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])
            (mdescriptor,
             &(this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
              Tu);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])
            (mdescriptor,
             &(this->
              super_ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
              Tv);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Rx);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Ru);
  (*mdescriptor->_vptr_ChSystemDescriptor[3])(mdescriptor,&this->Rv);
  return;
}

Assistant:

virtual void InjectConstraints(ChSystemDescriptor& mdescriptor) override {
        // base behaviour too
        ChContactNSC<Ta, Tb>::InjectConstraints(mdescriptor);

        mdescriptor.InsertConstraint(&Rx);
        mdescriptor.InsertConstraint(&Ru);
        mdescriptor.InsertConstraint(&Rv);
    }